

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O2

int dothrow(obj *obj)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = multi;
  multi = 0;
  if (((youmonst.data)->mflags1 & 0x800) == 0) {
    bVar1 = check_capacity((char *)0x0);
    if (bVar1 == '\0') {
      if (obj == (obj *)0x0) {
        if (uwep == (obj *)0x0) {
          pcVar3 = "\x13\x14\f\x02";
        }
        else {
          pcVar3 = "\x13\x14\f\x02";
          if (objects[uwep->otyp].oc_subtyp == '\x17') {
            pcVar3 = "\x13\x14\f\r";
          }
        }
        obj = getobj(pcVar3,"throw",(obj **)0x0);
        if (obj != (obj *)0x0) goto LAB_0017b5f0;
      }
      else {
        if (uwep == (obj *)0x0) {
          pcVar3 = "\x13\x14\f\x02";
        }
        else {
          pcVar3 = "\x13\x14\f\x02";
          if (objects[uwep->otyp].oc_subtyp == '\x17') {
            pcVar3 = "\x13\x14\f\r";
          }
        }
        bVar1 = validate_object(obj,pcVar3,"throw");
        if (bVar1 != '\0') {
LAB_0017b5f0:
          iVar2 = throw_obj(obj,iVar2,'\0');
          return iVar2;
        }
      }
    }
  }
  else {
    pline("You are physically incapable of throwing anything.");
  }
  return 0;
}

Assistant:

int dothrow(struct obj *obj)
{
	int shotlimit;

	/*
	 * Since some characters shoot multiple missiles at one time,
	 * allow user to specify a count prefix for 'f' or 't' to limit
	 * number of items thrown (to avoid possibly hitting something
	 * behind target after killing it, or perhaps to conserve ammo).
	 *
	 * Prior to 3.3.0, command ``3t'' meant ``t(shoot) t(shoot) t(shoot)''
	 * and took 3 turns.  Now it means ``t(shoot at most 3 missiles)''.
	 */
	shotlimit = multi;
	multi = 0;		/* reset; it's been used up */

	if (notake(youmonst.data)) {
	    pline("You are physically incapable of throwing anything.");
	    return 0;
	}

	if (check_capacity(NULL)) return 0;
	
	if (obj && !validate_object(obj, uslinging() ? bullets : toss_objs, "throw"))
	    return 0;
	else if (!obj)
	    obj = getobj(uslinging() ? bullets : toss_objs, "throw", NULL);
	/* it is also possible to throw food */
	/* (or jewels, or iron balls... ) */

	if (!obj) return 0;
	return throw_obj(obj, shotlimit, FALSE);
}